

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O1

void chrono::collision::recurse_scan_AABBs
               (CHAABBTree *mmodel,int nb,void *userdata,int current_level,int *counter,
               _func_void_ChMatrix33<double>_ptr_Vector_ptr_Vector_ptr_int_void_ptr *callback)

{
  int nb_00;
  pointer pCVar1;
  ActualDstType actualDst;
  ChMatrix33<double> Rot;
  ChMatrix33<double> local_78;
  
  *counter = *counter + 1;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  pCVar1 = (mmodel->b).
           super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (*callback)(&local_78,&pCVar1[nb].To,&pCVar1[nb].d,current_level,userdata);
  nb_00 = (mmodel->b).
          super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
          _M_impl.super__Vector_impl_data._M_start[nb].first_child;
  if (-1 < nb_00) {
    recurse_scan_AABBs(mmodel,nb_00,userdata,current_level + 1,counter,callback);
    recurse_scan_AABBs(mmodel,nb_00 + 1,userdata,current_level + 1,counter,callback);
  }
  return;
}

Assistant:

void recurse_scan_AABBs(CHAABBTree* mmodel,
                        int nb,
                        void* userdata,
                        int current_level,
                        int& counter,
                        void callback(ChMatrix33<>& Rot, Vector& Pos, Vector& d, int level, void* userdata)) {
    counter++;

    // compute root-relative coords for each box
    ChMatrix33<> Rot;
    Rot.setIdentity();

    // execute callback
    callback(Rot, mmodel->child(nb)->To, mmodel->child(nb)->d, current_level, userdata);

    // break recursion on leaf
    if (mmodel->child(nb)->IsLeaf())
        return;

    int c1 = mmodel->child(nb)->first_child;
    int c2 = c1 + 1;

    int new_currlevel = current_level + 1;

    recurse_scan_AABBs(mmodel, c1, userdata, new_currlevel, counter, callback);

    recurse_scan_AABBs(mmodel, c2, userdata, new_currlevel, counter, callback);
}